

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_nav2D.cpp
# Opt level: O0

void __thiscall
EnvironmentNAV2D::GetSuccs
          (EnvironmentNAV2D *this,int SourceStateID,vector<int,_std::allocator<int>_> *SuccIDV,
          vector<int,_std::allocator<int>_> *CostV)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  reference ppEVar4;
  ulong uVar5;
  vector<int,_std::allocator<int>_> *this_00;
  int in_ESI;
  long *in_RDI;
  EnvNAV2DHashEntry_t *OutHashEntry;
  int cost;
  int costmult;
  int newY;
  int newX;
  bool bTestBounds;
  EnvNAV2DHashEntry_t *HashEntry;
  int aind;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint uVar6;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd0;
  value_type pEVar7;
  int local_24;
  
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x15feeb);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x15fef5);
  std::vector<int,_std::allocator<int>_>::reserve
            (in_stack_ffffffffffffffd0,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
            );
  std::vector<int,_std::allocator<int>_>::reserve
            (in_stack_ffffffffffffffd0,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
            );
  if (in_ESI != *(int *)((long)in_RDI + 0x214)) {
    ppEVar4 = std::vector<ENVHASHENTRY_*,_std::allocator<ENVHASHENTRY_*>_>::operator[]
                        ((vector<ENVHASHENTRY_*,_std::allocator<ENVHASHENTRY_*>_> *)(in_RDI + 0x45),
                         (long)in_ESI);
    pEVar7 = *ppEVar4;
    uVar6 = 0;
    if ((((pEVar7->X < 2) || ((int)in_RDI[5] + -2 <= pEVar7->X)) || (pEVar7->Y < 2)) ||
       (*(int *)((long)in_RDI + 0x2c) + -2 <= pEVar7->Y)) {
      uVar6 = 0x1000000;
    }
    for (local_24 = 0; local_24 < *(int *)((long)in_RDI + 0x20c); local_24 = local_24 + 1) {
      iVar2 = pEVar7->X + *(int *)((long)in_RDI + (long)local_24 * 4 + 0x4c);
      iVar3 = pEVar7->Y + *(int *)((long)in_RDI + (long)local_24 * 4 + 0x8c);
      if (((uVar6 & 0x1000000) == 0) ||
         (uVar5 = (**(code **)(*in_RDI + 0x1b8))(in_RDI,iVar2,iVar3), (uVar5 & 1) != 0)) {
        bVar1 = *(byte *)(*(long *)(in_RDI[8] + (long)iVar2 * 8) + (long)iVar3);
        if ((iVar2 == pEVar7->X) || ((iVar3 == pEVar7->Y || (7 < local_24)))) {
          if (7 < local_24) {
            if (bVar1 <= *(byte *)(*(long *)(in_RDI[8] +
                                            (long)(pEVar7->X +
                                                  *(int *)((long)in_RDI + (long)local_24 * 8 + 0xcc)
                                                  ) * 8) +
                                  (long)(pEVar7->Y +
                                        *(int *)((long)in_RDI + (long)local_24 * 8 + 0x14c)))) {
              bVar1 = *(byte *)(*(long *)(in_RDI[8] +
                                         (long)(pEVar7->X +
                                               *(int *)((long)in_RDI + (long)local_24 * 8 + 0xcc)) *
                                         8) +
                               (long)(pEVar7->Y +
                                     *(int *)((long)in_RDI + (long)local_24 * 8 + 0x14c)));
            }
            if (bVar1 <= *(byte *)(*(long *)(in_RDI[8] +
                                            (long)(pEVar7->X + (int)in_RDI[(long)local_24 + 0x1a]) *
                                            8) +
                                  (long)(pEVar7->Y + (int)in_RDI[(long)local_24 + 0x2a]))) {
              bVar1 = *(byte *)(*(long *)(in_RDI[8] +
                                         (long)(pEVar7->X + (int)in_RDI[(long)local_24 + 0x1a]) * 8)
                               + (long)(pEVar7->Y + (int)in_RDI[(long)local_24 + 0x2a]));
            }
          }
        }
        else {
          if (bVar1 <= *(byte *)(*(long *)(in_RDI[8] + (long)pEVar7->X * 8) + (long)iVar3)) {
            bVar1 = *(byte *)(*(long *)(in_RDI[8] + (long)pEVar7->X * 8) + (long)iVar3);
          }
          if (bVar1 <= *(byte *)(*(long *)(in_RDI[8] + (long)iVar2 * 8) + (long)pEVar7->Y)) {
            bVar1 = *(byte *)(*(long *)(in_RDI[8] + (long)iVar2 * 8) + (long)pEVar7->Y);
          }
        }
        if (bVar1 < *(byte *)(in_RDI + 9)) {
          this_00 = (vector<int,_std::allocator<int>_> *)
                    (**(code **)(*in_RDI + 0x198))(in_RDI,iVar2,iVar3);
          if (this_00 == (vector<int,_std::allocator<int>_> *)0x0) {
            this_00 = (vector<int,_std::allocator<int>_> *)
                      (**(code **)(*in_RDI + 0x1a0))(in_RDI,iVar2,iVar3);
          }
          std::vector<int,_std::allocator<int>_>::push_back(this_00,(value_type_conflict1 *)in_RDI);
          std::vector<int,_std::allocator<int>_>::push_back(this_00,(value_type_conflict1 *)in_RDI);
        }
      }
    }
  }
  return;
}

Assistant:

void EnvironmentNAV2D::GetSuccs(int SourceStateID, vector<int>* SuccIDV, vector<int>* CostV)
{
    int aind;

#if TIME_DEBUG
    clock_t currenttime = clock();
#endif

    //clear the successor array
    SuccIDV->clear();
    CostV->clear();
    SuccIDV->reserve(EnvNAV2DCfg.numofdirs);
    CostV->reserve(EnvNAV2DCfg.numofdirs);

    //goal state should be absorbing
    if (SourceStateID == EnvNAV2D.goalstateid) return;

    //get X, Y for the state
    EnvNAV2DHashEntry_t* HashEntry = EnvNAV2D.StateID2CoordTable[SourceStateID];

    //iterate through actions
    bool bTestBounds = false;
    if (HashEntry->X <= 1 || HashEntry->X >= EnvNAV2DCfg.EnvWidth_c - 2 || HashEntry->Y <= 1 ||
        HashEntry->Y >= EnvNAV2DCfg.EnvHeight_c - 2)
    {
        bTestBounds = true;
    }
    for (aind = 0; aind < EnvNAV2DCfg.numofdirs; aind++) {
        int newX = HashEntry->X + EnvNAV2DCfg.dx_[aind];
        int newY = HashEntry->Y + EnvNAV2DCfg.dy_[aind];

        //skip the invalid cells
        if (bTestBounds) {
            if (!IsValidCell(newX, newY)) continue;
        }

        int costmult = EnvNAV2DCfg.Grid2D[newX][newY];

        //for diagonal move, take max over adjacent cells
        if (newX != HashEntry->X && newY != HashEntry->Y && aind <= 7) {
            costmult = __max(costmult, EnvNAV2DCfg.Grid2D[HashEntry->X][newY]);
            costmult = __max(costmult, EnvNAV2DCfg.Grid2D[newX][HashEntry->Y]);
        }
        else if (aind > 7) {
            //check two more cells through which the action goes
            costmult = __max(costmult,
                             EnvNAV2DCfg.Grid2D[HashEntry->X + EnvNAV2DCfg.dxintersects_[aind][0]][HashEntry->Y
                                 + EnvNAV2DCfg.dyintersects_[aind][0]]);
            costmult = __max(costmult,
                             EnvNAV2DCfg.Grid2D[HashEntry->X + EnvNAV2DCfg.dxintersects_[aind][1]][HashEntry->Y
                                 + EnvNAV2DCfg.dyintersects_[aind][1]]);
        }

        //check that it is valid
        if (costmult >= EnvNAV2DCfg.obsthresh) continue;

        //otherwise compute the actual cost
        int cost = (costmult + 1) * EnvNAV2DCfg.dxy_distance_mm_[aind];

        EnvNAV2DHashEntry_t* OutHashEntry;
        if ((OutHashEntry = GetHashEntry(newX, newY)) == NULL) {
            //have to create a new entry
            OutHashEntry = CreateNewHashEntry(newX, newY);
        }

        SuccIDV->push_back(OutHashEntry->stateID);
        CostV->push_back(cost);
    }

#if TIME_DEBUG
    time_getsuccs += clock()-currenttime;
#endif
}